

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiReturn __thiscall Assimp::Importer::UnregisterLoader(Importer *this,BaseImporter *pImp)

{
  BaseImporter **__src;
  ImporterPimpl *pIVar1;
  BaseImporter **ppBVar2;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  __dest;
  BaseImporter **ppBVar3;
  Logger *pLVar4;
  aiReturn aVar5;
  BaseImporter *local_28;
  
  if (pImp == (BaseImporter *)0x0) {
    aVar5 = aiReturn_SUCCESS;
  }
  else {
    local_28 = pImp;
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<Assimp::BaseImporter**,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::BaseImporter*const>>
                       ((this->pimpl->mImporter).
                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->pimpl->mImporter).
                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_28);
    pIVar1 = this->pimpl;
    ppBVar2 = (pIVar1->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__dest._M_current == ppBVar2) {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,"Unable to remove custom importer: I can\'t find you ...");
    }
    else {
      __src = __dest._M_current + 1;
      ppBVar3 = ppBVar2;
      if (__src != ppBVar2) {
        memmove(__dest._M_current,__src,(long)ppBVar2 - (long)__src);
        ppBVar3 = (pIVar1->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      (pIVar1->mImporter).
      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar3 + -1;
      pLVar4 = DefaultLogger::get();
      Logger::info(pLVar4,"Unregistering custom importer: ");
    }
    aVar5 = -(uint)(__dest._M_current == ppBVar2);
  }
  return aVar5;
}

Assistant:

aiReturn Importer::UnregisterLoader(BaseImporter* pImp) {
    if(!pImp) {
        // unregistering a NULL importer is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseImporter*>::iterator it = std::find(pimpl->mImporter.begin(),
        pimpl->mImporter.end(),pImp);

    if (it != pimpl->mImporter.end())   {
        pimpl->mImporter.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom importer: ");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom importer: I can't find you ...");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}